

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O0

int elements234(node234_conflict *n)

{
  int local_14;
  int i;
  node234_conflict *n_local;
  
  for (local_14 = 0; (local_14 < 3 && (n->elems[local_14] != (void *)0x0)); local_14 = local_14 + 1)
  {
  }
  return local_14;
}

Assistant:

static int elements234(node234 *n)
{
    int i;
    for (i = 0; i < 3; i++)
        if (!n->elems[i])
            break;
    return i;
}